

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O3

int fetch_all_shapes_db(feed_db_t *db,shape_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  shape_t *psVar4;
  uchar *__src;
  long lVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  sqlite3_stmt *stmt;
  shape_t record;
  char qr [97];
  sqlite3_stmt *local_120;
  double local_118;
  double local_110;
  shape_t local_108;
  char local_98 [96];
  undefined1 local_38;
  
  bVar9 = 0;
  uVar2 = count_rows_db(db,"shapes");
  if (0 < (int)uVar2) {
    pcVar7 = 
    "SELECT shape_id,shape_pt_lat, shape_pt_lon,shape_pt_sequence, shape_dist_traveled FROM `shapes`;"
    ;
    pcVar8 = local_98;
    for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
      pcVar8 = pcVar8 + (ulong)bVar9 * -0x10 + 8;
    }
    local_38 = 0;
    sqlite3_prepare_v2(db->conn,local_98,-1,&local_120,(char **)0x0);
    psVar4 = (shape_t *)malloc((ulong)uVar2 * 0x70);
    *records = psVar4;
    uVar1 = 0xffffffff;
    if (psVar4 != (shape_t *)0x0) {
      lVar5 = 0;
      do {
        iVar3 = sqlite3_step(local_120);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_shape(&local_108);
        __src = sqlite3_column_text(local_120,0);
        strcpy(local_108.id,(char *)__src);
        local_110 = sqlite3_column_double(local_120,1);
        local_108.pt_lat = (longdouble)local_110;
        local_118 = sqlite3_column_double(local_120,2);
        local_108.pt_lon = (longdouble)local_118;
        local_108.pt_sequence = sqlite3_column_int(local_120,3);
        local_108.dist_traveled = sqlite3_column_double(local_120,4);
        psVar4 = &local_108;
        pcVar7 = (*records)->id + lVar5;
        for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined8 *)pcVar7 = *(undefined8 *)psVar4->id;
          psVar4 = (shape_t *)((long)psVar4 + (ulong)bVar9 * -0x10 + 8);
          pcVar7 = pcVar7 + ((ulong)bVar9 * -2 + 1) * 8;
        }
        lVar5 = lVar5 + 0x70;
      } while ((ulong)uVar2 * 0x70 - lVar5 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_120);
  }
  return uVar2;
}

Assistant:

int fetch_all_shapes_db(feed_db_t *db, shape_t **records) {

    shape_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "shapes");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "shape_id,"
                    "shape_pt_lat, shape_pt_lon,"
                    "shape_pt_sequence, shape_dist_traveled "
                "FROM `shapes`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_shape(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        record.pt_lat = sqlite3_column_double(stmt, 1);
        record.pt_lon = sqlite3_column_double(stmt, 2);
        record.pt_sequence = sqlite3_column_int(stmt, 3);
        record.dist_traveled = sqlite3_column_double(stmt, 4);

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}